

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QByteArray,QHashDummyValue>::emplace<QHashDummyValue_const&>
          (QHash<QByteArray,_QHashDummyValue> *this,QByteArray *key,QHashDummyValue *args)

{
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  piter pVar1;
  QByteArray copy;
  QByteArray *in_stack_ffffffffffffff88;
  QHashDummyValue *args_00;
  QByteArray *in_stack_ffffffffffffffa0;
  QHash<QByteArray,_QHashDummyValue> *in_stack_ffffffffffffffa8;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  args_00 = (QHashDummyValue *)&local_28;
  QByteArray::QByteArray(in_RDI,in_stack_ffffffffffffff88);
  pVar1 = (piter)emplace<QHashDummyValue_const&>
                           (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,args_00);
  QByteArray::~QByteArray((QByteArray *)0x18c3f6);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        Key copy = key; // Needs to be explicit for MSVC 2019
        return emplace(std::move(copy), std::forward<Args>(args)...);
    }